

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator-=(APInt *this,uint64_t RHS)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  uint64_t *puVar4;
  APInt *pAVar5;
  long lVar6;
  bool bVar7;
  
  uVar3 = this->BitWidth;
  if ((ulong)uVar3 < 0x41) {
    (this->U).pVal = (uint64_t *)((long)(this->U).pVal - RHS);
    pAVar5 = clearUnusedBits(this);
    return pAVar5;
  }
  puVar4 = (this->U).pVal;
  lVar6 = 0;
  do {
    puVar1 = puVar4 + lVar6;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - RHS;
    if (RHS <= uVar2) break;
    RHS = 1;
    bVar7 = ((ulong)uVar3 + 0x3f >> 6) - 1 != lVar6;
    lVar6 = lVar6 + 1;
  } while (bVar7);
  pAVar5 = this;
  uVar3 = this->BitWidth;
  if (0x40 < (ulong)uVar3) {
    this = (APInt *)((this->U).pVal + ((int)((ulong)uVar3 + 0x3f >> 6) - 1));
  }
  (this->U).VAL = ((this->U).VAL << (-(char)uVar3 & 0x3fU)) >> (-(char)uVar3 & 0x3fU);
  return pAVar5;
}

Assistant:

bool isSingleWord() const { return BitWidth <= APINT_BITS_PER_WORD; }